

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O0

t_object * __thiscall xemmai::t_tuple::f_string(t_tuple *this)

{
  t_stringer *ptVar1;
  t_object *ptVar2;
  t_string *this_00;
  wstring_view a_s;
  undefined1 local_40 [8];
  t_value<xemmai::t_pointer> x;
  size_t i;
  t_stringer s;
  t_tuple *this_local;
  
  s.v_j = (wchar_t *)this;
  t_stringer::t_stringer((t_stringer *)&i);
  ptVar1 = t_stringer::operator<<((t_stringer *)&i,L'\'');
  t_stringer::operator<<(ptVar1,L'(');
  if (this->v_size != 0) {
    x.field_0.v_integer = 0;
    while( true ) {
      operator[](this,x.field_0.v_integer);
      t_value<xemmai::t_slot>::f_string((t_value<xemmai::t_slot> *)local_40);
      ptVar2 = t_pointer::operator_cast_to_t_object_((t_pointer *)local_40);
      f_check<xemmai::t_string>(ptVar2,L"value");
      ptVar2 = t_pointer::operator->((t_pointer *)local_40);
      this_00 = t_object::f_as<xemmai::t_string>(ptVar2);
      a_s = t_string::operator_cast_to_basic_string_view(this_00);
      t_stringer::operator<<((t_stringer *)&i,a_s);
      x.field_0.v_integer = x.field_0.v_integer + 1;
      if (this->v_size <= (ulong)x.field_0) break;
      ptVar1 = t_stringer::operator<<((t_stringer *)&i,L',');
      t_stringer::operator<<(ptVar1,L' ');
    }
  }
  ptVar1 = t_stringer::operator<<((t_stringer *)&i,L')');
  ptVar2 = t_stringer::operator_cast_to_t_object_(ptVar1);
  return ptVar2;
}

Assistant:

t_object* t_tuple::f_string() const
{
	t_stringer s;
	s << L'\'' << L'(';
	if (v_size > 0) for (size_t i = 0;;) {
		auto x = (*this)[i].f_string();
		f_check<t_string>(x, L"value");
		s << x->f_as<t_string>();
		if (++i >= v_size) break;
		s << L',' << L' ';
	}
	return s << L')';
}